

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void MD5Final(uchar *digest,MD5Context *ctx)

{
  int iVar1;
  uint uVar2;
  undefined1 *puVar3;
  undefined1 *__s;
  uint32 *in_RSI;
  undefined8 *in_RDI;
  uint32 *in32;
  uchar *p;
  uint count;
  
  uVar2 = in_RSI[4] >> 3 & 0x3f;
  puVar3 = (undefined1 *)((long)in_RSI + (ulong)uVar2 + 0x18);
  __s = puVar3 + 1;
  *puVar3 = 0x80;
  iVar1 = -uVar2;
  uVar2 = iVar1 + 0x3f;
  if (uVar2 < 8) {
    memset(__s,0,(ulong)uVar2);
    MD5Transform(in_RSI,in_RSI + 6);
    memset(in_RSI + 6,0,0x38);
  }
  else {
    memset(__s,0,(ulong)(iVar1 + 0x37));
  }
  in_RSI[0x14] = in_RSI[4];
  in_RSI[0x15] = in_RSI[5];
  MD5Transform(in_RSI,in_RSI + 6);
  *in_RDI = *(undefined8 *)in_RSI;
  in_RDI[1] = *(undefined8 *)(in_RSI + 2);
  memset(in_RSI,0,0x58);
  return;
}

Assistant:

void MD5Final(unsigned char digest[16], struct MD5Context *ctx)
{
  unsigned int count;
  unsigned char *p;
  uint32 *in32 = (uint32 *)ctx->in;

  /* Compute number of bytes mod 64 */
  count = (ctx->bits[0] >> 3) & 0x3F;

  /* Set the first char of padding to 0x80.  This is safe since there is
     always at least one byte free */
  p = ctx->in + count;
  *p++ = 0x80;

  /* Bytes of padding needed to make 64 bytes */
  count = 64 - 1 - count;

  /* Pad out to 56 mod 64 */
  if (count < 8) {
    /* Two lots of padding:  Pad the first block to 64 bytes */
    memset(p, 0, count);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);

    /* Now fill the next block with 56 bytes */
    memset(ctx->in, 0, 56);
  } else {
    /* Pad block to 56 bytes */
    memset(p, 0, count - 8);
  }
  byteReverse(ctx->in, 14);

  /* Append length in bits and transform */
  in32[14] = ctx->bits[0];
  in32[15] = ctx->bits[1];

  MD5Transform(ctx->buf, (uint32 *)ctx->in);
  byteReverse((unsigned char *)ctx->buf, 4);
  memcpy(digest, ctx->buf, 16);
  memset(ctx, 0, sizeof(struct MD5Context));     /* In case it's sensitive */
}